

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

void __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder>::_logBlock
          (RACFGBuilderT<asmjit::v1_14::x86::RACFGBuilder> *this,RABlock *block,uint32_t indentation
          )

{
  StringTmp<512UL> *this_00;
  ulong uVar1;
  undefined1 *puVar2;
  
  this_00 = &this->_sb;
  String::clear((String *)this_00);
  String::_opChars((String *)this_00,kAppend,' ',(ulong)indentation);
  String::_opFormat((String *)this_00,kAppend,"{#%u}\n",(ulong)*(uint *)(block + 8));
  uVar1 = (ulong)(byte)this->_sb;
  if (uVar1 < 0x1f) {
    puVar2 = &this->field_0x69;
  }
  else {
    puVar2 = *(undefined1 **)&this->field_0x80;
    uVar1 = *(ulong *)&this->field_0x70;
  }
  (*this->_logger->_vptr_Logger[2])(this->_logger,puVar2,uVar1);
  this->_lastLoggedBlock = block;
  return;
}

Assistant:

void _logBlock(RABlock* block, uint32_t indentation) noexcept {
    _sb.clear();
    _sb.appendChars(' ', indentation);
    _sb.appendFormat("{#%u}\n", block->blockId());
    _logger->log(_sb);
    _lastLoggedBlock = block;
  }